

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O2

bool __thiscall
CLI::App::_parse_single
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool *positional_only)

{
  bool bVar1;
  Classifier current_type;
  bool bVar2;
  HorribleError *this_00;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  if (*positional_only == false) {
    current_type = _recognize(this,(string *)
                                   ((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish + -1),true);
    switch(current_type) {
    case NONE:
      goto switchD_0012a8bc_caseD_0;
    case POSITIONAL_MARK:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(args);
      *positional_only = true;
      bVar2 = _has_remaining_positionals(this);
      if ((bVar2) || (this->parent_ == (App *)0x0)) {
        ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"--",&local_61);
        _move_to_missing(this,POSITIONAL_MARK,&local_60);
        ::std::__cxx11::string::~string((string *)&local_60);
        return true;
      }
      break;
    case SHORT:
    case LONG:
    case WINDOWS_STYLE:
      bVar2 = _parse_arg(this,args,current_type,false);
      return bVar2;
    case SUBCOMMAND:
      bVar2 = _parse_subcommand(this,args);
      return bVar2;
    case SUBCOMMAND_TERMINATOR:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(args);
      break;
    default:
      this_00 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"unrecognized classifier (you should not see this!)",
                 (allocator<char> *)&local_60);
      HorribleError::HorribleError(this_00,&local_40);
      __cxa_throw(this_00,&HorribleError::typeinfo,Error::~Error);
    }
    bVar2 = false;
  }
  else {
switchD_0012a8bc_caseD_0:
    bVar2 = false;
    bVar1 = _parse_positional(this,args,false);
    if ((bVar1) && (bVar2 = true, this->positionals_at_end_ == true)) {
      *positional_only = true;
    }
  }
  return bVar2;
}

Assistant:

CLI11_INLINE bool App::_parse_single(std::vector<std::string> &args, bool &positional_only) {
    bool retval = true;
    detail::Classifier classifier = positional_only ? detail::Classifier::NONE : _recognize(args.back());
    switch(classifier) {
    case detail::Classifier::POSITIONAL_MARK:
        args.pop_back();
        positional_only = true;
        if((!_has_remaining_positionals()) && (parent_ != nullptr)) {
            retval = false;
        } else {
            _move_to_missing(classifier, "--");
        }
        break;
    case detail::Classifier::SUBCOMMAND_TERMINATOR:
        // treat this like a positional mark if in the parent app
        args.pop_back();
        retval = false;
        break;
    case detail::Classifier::SUBCOMMAND:
        retval = _parse_subcommand(args);
        break;
    case detail::Classifier::LONG:
    case detail::Classifier::SHORT:
    case detail::Classifier::WINDOWS_STYLE:
        // If already parsed a subcommand, don't accept options_
        retval = _parse_arg(args, classifier, false);
        break;
    case detail::Classifier::NONE:
        // Probably a positional or something for a parent (sub)command
        retval = _parse_positional(args, false);
        if(retval && positionals_at_end_) {
            positional_only = true;
        }
        break;
        // LCOV_EXCL_START
    default:
        throw HorribleError("unrecognized classifier (you should not see this!)");
        // LCOV_EXCL_STOP
    }
    return retval;
}